

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_upload.c
# Opt level: O1

Qiniu_Error
readMedium(Qiniu_Record_Medium *medium,char **uploadId,Qiniu_Uint64 *expireAt,
          Qiniu_UploadPartResp *ret)

{
  cJSON *self;
  Qiniu_Int64 QVar1;
  char *pcVar2;
  Qiniu_Uint64 QVar3;
  Qiniu_Error QVar6;
  char *extraout_RDX;
  char *pcVar4;
  ulong uVar5;
  size_t haveRead;
  char buf [4096];
  ulong local_1040;
  char local_1038 [4104];
  
  QVar6.code = (*medium->readEntry)(medium,local_1038,0x1000,&local_1040);
  pcVar4 = extraout_RDX;
  if (QVar6.code == (Qiniu_Error)0xc8) {
    if (local_1040 < 0x1000) {
      self = cJSON_Parse(local_1038);
      QVar1 = Qiniu_Json_GetInt64(self,"partNum",-1);
      ret->partNum = (int)QVar1;
      pcVar2 = Qiniu_Json_GetString(self,"md5",(char *)0x0);
      pcVar2 = Qiniu_String_Dup(pcVar2);
      ret->md5 = pcVar2;
      pcVar2 = Qiniu_Json_GetString(self,"etag",(char *)0x0);
      pcVar2 = Qiniu_String_Dup(pcVar2);
      ret->etag = pcVar2;
      if (uploadId != (char **)0x0) {
        pcVar2 = Qiniu_Json_GetString(self,"uploadId",(char *)0x0);
        pcVar2 = Qiniu_String_Dup(pcVar2);
        *uploadId = pcVar2;
      }
      if (expireAt != (Qiniu_Uint64 *)0x0) {
        QVar3 = Qiniu_Json_GetUInt64(self,"expireAt",0);
        *expireAt = QVar3;
      }
      cJSON_Delete(self);
      uVar5 = 200;
    }
    else {
      (*medium->close)(medium);
      pcVar4 = "recorder entry is too large";
      uVar5 = 500;
    }
  }
  else {
    uVar5 = (ulong)(uint)QVar6.code;
    (*medium->close)(medium);
  }
  QVar6.message = pcVar4;
  QVar6._0_8_ = uVar5;
  return QVar6;
}

Assistant:

Qiniu_Error readMedium(struct Qiniu_Record_Medium *medium, char **uploadId, Qiniu_Uint64 *expireAt, Qiniu_UploadPartResp *ret)
{
    Qiniu_Error err = Qiniu_OK;
#define BUFFER_SIZE (1 << 12)
    size_t haveRead;
    char buf[BUFFER_SIZE];
    err = medium->readEntry(medium, buf, BUFFER_SIZE, &haveRead);
    if (err.code != 200)
    {
        medium->close(medium);
        return err;
    }
    if (haveRead >= BUFFER_SIZE)
    {
        medium->close(medium);
        err.code = 500;
        err.message = "recorder entry is too large";
        return err;
    }
    cJSON *blockInfo = cJSON_Parse(buf);
    ret->partNum = (int)Qiniu_Json_GetInt64(blockInfo, "partNum", -1);
    ret->md5 = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "md5", NULL));
    ret->etag = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "etag", NULL));
    if (uploadId != NULL)
    {
        *uploadId = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "uploadId", NULL));
    }
    if (expireAt != NULL)
    {
        *expireAt = Qiniu_Json_GetUInt64(blockInfo, "expireAt", 0);
    }
    cJSON_Delete(blockInfo);
    return err;
#undef BUFFER_SIZE
}